

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
o4_roots<float>(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
               Matrix<float,_5,_1,_0,_5,_1> *p)

{
  double dVar1;
  double extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  undefined1 auVar2 [16];
  undefined8 extraout_XMM0_Qb;
  double dVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  complex<double> w;
  complex<double> P;
  complex<double> Q;
  complex<double> R;
  undefined1 local_c8 [16];
  double local_b8;
  double local_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  ulong uStack_90;
  undefined1 local_88 [24];
  double local_70;
  double local_68;
  double dStack_60;
  double local_50;
  double local_48;
  double local_40 [2];
  complex<double> local_30;
  double local_20;
  double local_18;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = (double)(p->super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>).m_storage.
                     m_data.array[0];
  local_b8 = (double)(p->super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>).m_storage.
                     m_data.array[1];
  dVar8 = (double)(p->super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>).m_storage.m_data.
                  array[2];
  dVar9 = (double)(p->super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>).m_storage.m_data.
                  array[3];
  dVar6 = local_50 * local_50;
  dVar5 = local_b8 * local_b8;
  dVar7 = dVar6 * local_50;
  dVar3 = 3.0;
  uVar4 = 0;
  local_68 = dVar8 / local_50 - (dVar5 * 3.0) / (dVar6 * 8.0);
  dVar1 = (double)(p->super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>).m_storage.m_data.
                  array[4] / local_50 +
          (local_b8 * dVar9) / (dVar6 * -4.0) +
          (dVar5 * dVar8) / (dVar7 * 16.0) +
          (dVar5 * local_b8 * local_b8 * 3.0) / (dVar7 * local_50 * -256.0);
  local_40[0] = (local_68 * local_68) / -12.0 - dVar1;
  local_40[1] = 0.0;
  local_b0 = dVar9 / local_50 +
             ((dVar5 * local_b8) / (dVar7 * 8.0) - (local_b8 * dVar8) / (dVar6 + dVar6));
  local_48 = local_b0 * local_b0 * -0.125 +
             (dVar1 * local_68) / 3.0 + (local_68 * local_68 * local_68) / -108.0;
  local_30._M_value._8_8_ = 0;
  local_88._0_8_ = 2.0;
  local_30._M_value._0_8_ = local_48;
  std::pow<double>(&local_30,(double *)local_88);
  local_70 = 3.0;
  local_a8 = dVar3;
  uStack_a0 = uVar4;
  local_98 = extraout_XMM0_Qa;
  std::pow<double>((complex<double> *)local_40,&local_70);
  auVar2._8_8_ = dVar3;
  auVar2._0_8_ = extraout_XMM0_Qa_00;
  auVar2 = divpd(auVar2,_DAT_00480b20);
  local_c8._0_8_ = auVar2._0_8_ + local_98 * 0.25;
  local_c8._8_8_ = auVar2._8_8_ + local_a8 * 0.25;
  std::sqrt<double>((complex<double> *)local_c8);
  local_20 = extraout_XMM0_Qa_01 - local_48 * 0.5;
  local_c8._0_8_ = 0.3333333333333333;
  local_18 = dVar3;
  std::pow<double>((complex<double> *)&local_20,(double *)local_c8);
  if ((extraout_XMM0_Qa_02 != 0.0) || (NAN(extraout_XMM0_Qa_02))) {
    local_c8._0_8_ = extraout_XMM0_Qa_02 * 3.0;
    local_c8._8_8_ = dVar3 * 3.0;
    local_a8 = extraout_XMM0_Qa_02;
    uStack_a0 = extraout_XMM0_Qb;
    local_98 = dVar3;
    uStack_90 = uVar4;
    std::operator/((complex<double> *)local_40,(complex<double> *)local_c8);
    local_a8 = local_a8 + ((local_68 * -5.0) / 6.0 - extraout_XMM0_Qa_04);
    dVar3 = local_98 - dVar3;
  }
  else {
    local_c8._0_8_ = 0.3333333333333333;
    std::pow<double>(&local_30,(double *)local_c8);
    uStack_a0 = 0;
    dVar3 = -dVar3;
    uStack_90 = uVar4 ^ 0x8000000000000000;
    local_a8 = (local_68 * -5.0) / 6.0 - extraout_XMM0_Qa_03;
  }
  local_a8 = local_a8 + local_a8;
  dVar3 = dVar3 + dVar3;
  local_88._0_8_ = local_68 + local_a8;
  local_98 = dVar3;
  local_88._8_8_ = dVar3;
  std::sqrt<double>((complex<double> *)local_88);
  local_b0 = local_b0 + local_b0;
  local_c8._0_8_ = extraout_XMM0_Qa_05;
  local_c8._8_8_ = dVar3;
  local_70 = local_b0;
  std::operator/(&local_70,(complex<double> *)local_c8);
  local_68 = local_68 * 3.0 + local_a8;
  dStack_60 = local_98;
  local_88._0_8_ = -(extraout_XMM0_Qa_06 + local_68);
  local_88._8_8_ = -(dVar3 + local_98);
  std::sqrt<double>((complex<double> *)local_88);
  dVar1 = ABS((dVar3 + (double)local_c8._8_8_) * 0.5);
  local_b8 = local_b8 / (local_50 * -4.0);
  if (dVar1 < 1e-06) {
    local_88._0_4_ = (float)((extraout_XMM0_Qa_07 + (double)local_c8._0_8_) * 0.5 + local_b8);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (__return_storage_ptr__,(float *)local_88);
  }
  local_70 = local_b0;
  std::operator/(&local_70,(complex<double> *)local_c8);
  local_88._0_8_ = -(extraout_XMM0_Qa_08 + local_68);
  local_88._8_8_ = -(dVar1 + dStack_60);
  std::sqrt<double>((complex<double> *)local_88);
  dVar3 = 1e-06;
  if (ABS(((double)local_c8._8_8_ - dVar1) * 0.5) < 1e-06) {
    local_88._0_4_ = (float)(((double)local_c8._0_8_ - extraout_XMM0_Qa_09) * 0.5 + local_b8);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (__return_storage_ptr__,(float *)local_88);
  }
  local_70 = local_b0;
  local_a8 = (double)local_c8._8_8_;
  local_98 = (double)local_c8._0_8_;
  std::operator/(&local_70,(complex<double> *)local_c8);
  dVar5 = -(local_68 - extraout_XMM0_Qa_10);
  local_88._8_8_ = -(dStack_60 - dVar3);
  local_88._0_8_ = dVar5;
  std::sqrt<double>((complex<double> *)local_88);
  dVar1 = local_98;
  if (ABS((dVar5 - local_a8) * 0.5) < 1e-06) {
    local_88._0_4_ = (float)((extraout_XMM0_Qa_11 - local_98) * 0.5 + local_b8);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (__return_storage_ptr__,(float *)local_88);
    dVar1 = local_98;
  }
  local_a8 = (double)local_c8._0_8_;
  uStack_a0 = 0;
  local_98 = (double)local_c8._8_8_;
  uStack_90 = 0;
  local_70 = local_b0;
  std::operator/(&local_70,(complex<double> *)local_c8);
  dVar3 = -(local_68 - extraout_XMM0_Qa_12);
  local_88._8_8_ = -(dStack_60 - dVar1);
  local_88._0_8_ = dVar3;
  std::sqrt<double>((complex<double> *)local_88);
  if (ABS((-local_98 - dVar3) * 0.5) < 1e-06) {
    local_88._0_4_ = (float)(local_b8 + (-local_a8 - extraout_XMM0_Qa_13) * 0.5);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (__return_storage_ptr__,(float *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<floatPrec> o4_roots(const Matrix<floatPrec, 5, 1> &p)
{

  vector<floatPrec> realRoots;
  complex<double> temp;

  double A = (double)p(0, 0);
  double B = (double)p(1, 0);
  double C = (double)p(2, 0);
  double D = (double)p(3, 0);
  double E = (double)p(4, 0);

  double A_pw2 = A * A;
  double B_pw2 = B * B;
  double A_pw3 = A_pw2 * A;
  double B_pw3 = B_pw2 * B;
  double A_pw4 = A_pw3 * A;
  double B_pw4 = B_pw3 * B;

  double alpha = -3 * B_pw2 / (8 * A_pw2) + C / A;
  double beta = B_pw3 / (8 * A_pw3) - B * C / (2 * A_pw2) + D / A;
  double gamma = -3 * B_pw4 / (256 * A_pw4) + B_pw2 * C / (16 * A_pw3) - B * D / (4 * A_pw2) + E / A;

  double alpha_pw2 = alpha * alpha;
  double alpha_pw3 = alpha_pw2 * alpha;

  complex<double> P(-alpha_pw2 / 12.0 - gamma, 0);
  complex<double> Q(-alpha_pw3 / 108.0 + alpha * gamma / 3 - pow(beta, 2) / 8, 0);
  complex<double> R = -Q / 2.0 + sqrt(pow(Q, 2.0) / 4.0 + pow(P, 3.0) / 27.0);

  complex<double> U = pow(R, (1.0 / 3.0));
  complex<double> y;

  if (U.real() == 0)
    y = -5.0 * alpha / 6.0 - pow(Q, (1.0 / 3.0));
  else
    y = -5.0 * alpha / 6.0 - P / (3.0 * U) + U;

  complex<double> w = sqrt(alpha + 2.0 * y);

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (w + sqrt(-(3.0 * alpha + 2.0 * y + 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (w - sqrt(-(3.0 * alpha + 2.0 * y + 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (-w + sqrt(-(3.0 * alpha + 2.0 * y - 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (-w - sqrt(-(3.0 * alpha + 2.0 * y - 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  return realRoots;
}